

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompileType<unsigned_long>(void)

{
  unsigned_long result;
  unsigned_long x;
  bool b2;
  unsigned_long *p4;
  unsigned_long *p3;
  unsigned_long *r;
  unsigned_long *p2;
  unsigned_long *p1;
  longdouble ld;
  double d;
  float f;
  size_t size;
  wchar_t w;
  bool b;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> sb;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st;
  unsigned_long t;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> i;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> s;
  SafeInt *this;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffff48;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_30;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_28;
  unsigned_long local_20;
  undefined4 local_14;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_8;
  
  this = (SafeInt *)&local_8;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
           *)this);
  local_14 = 0;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<Foo>((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),(Foo *)this);
  local_20 = 0;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt(&local_28,&local_20);
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt(&local_30,false);
  CompiledMixedType<unsigned_long,char>();
  CompiledMixedType<unsigned_long,signed_char>();
  CompiledMixedType<unsigned_long,unsigned_char>();
  CompiledMixedType<unsigned_long,short>();
  CompiledMixedType<unsigned_long,unsigned_short>();
  CompiledMixedType<unsigned_long,int>();
  CompiledMixedType<unsigned_long,unsigned_int>();
  CompiledMixedType<unsigned_long,long>();
  CompiledMixedType<unsigned_long,unsigned_long>();
  CompiledMixedType<unsigned_long,long_long>();
  CompiledMixedType<unsigned_long,unsigned_long_long>();
  ModulusFriendTest<unsigned_long,char>();
  ModulusFriendTest<unsigned_long,signed_char>();
  ModulusFriendTest<unsigned_long,unsigned_char>();
  ModulusFriendTest<unsigned_long,short>();
  ModulusFriendTest<unsigned_long,unsigned_short>();
  ModulusFriendTest<unsigned_long,int>();
  ModulusFriendTest<unsigned_long,unsigned_int>();
  ModulusFriendTest<unsigned_long,long>();
  ModulusFriendTest<unsigned_long,unsigned_long>();
  ModulusFriendTest<unsigned_long,long_long>();
  ModulusFriendTest<unsigned_long,unsigned_long_long>();
  SafeInt::operator_cast_to_bool(this);
  SafeInt::operator_cast_to_wchar_t
            ((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  SafeInt::operator_cast_to_unsigned_long
            ((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  SafeInt::operator_cast_to_float
            ((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  SafeInt::operator_cast_to_double
            ((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  SafeInt::operator_cast_to_long_double
            ((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  Ptr(&local_8);
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  Ptr(&local_8);
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  Ref(&local_8);
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator&(&local_8);
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator&(&local_8);
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator!(&local_28);
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator+(&local_28);
  local_20 = SafeInt::operator_cast_to_unsigned_long
                       ((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator++(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator++((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator--(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator--((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator~((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)this);
  local_20 = SafeInt::operator_cast_to_unsigned_long
                       ((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  SafeNegation<unsigned_long>
            (CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),(unsigned_long *)this);
  return;
}

Assistant:

void CompileType()
{
	// Test constructors
	SafeInt<T> s;
	SafeInt<T> i(Foo::Foo1);
	T t = 0;
	SafeInt<T> st(t);
	SafeInt<T> sb(false);

	// Mixed operations
	CompiledMixedType<T, char>();
	CompiledMixedType<T, signed char>();
	CompiledMixedType<T, unsigned char>();
	CompiledMixedType<T, short>();
	CompiledMixedType<T, unsigned short>();
	CompiledMixedType<T, int>();
	CompiledMixedType<T, unsigned int>();
	CompiledMixedType<T, long>();
	CompiledMixedType<T, unsigned long>();
	CompiledMixedType<T, long long>();
	CompiledMixedType<T, unsigned long long>();

	// This is making trouble for the compiler
	ModulusFriendTest<T, char>();
	ModulusFriendTest<T, signed char>();
	ModulusFriendTest<T, unsigned char>();
	ModulusFriendTest<T, short>();
	ModulusFriendTest<T, unsigned short>();
	ModulusFriendTest<T, int>();
	ModulusFriendTest<T, unsigned int>();
	ModulusFriendTest<T, long>();
	ModulusFriendTest<T, unsigned long>();
	ModulusFriendTest<T, long long>();
	ModulusFriendTest<T, unsigned long long>();
	
	// Special case casts
	bool b = (bool)s;
	wchar_t w = (wchar_t)s;
	size_t size = (size_t)s;
	float f = (float)s;
	double d = (double)s;
	long double ld = (long double)s;

	// Pointer operations
	T* p1 = s.Ptr();
	const T* p2 = s.Ptr();
	const T& r = s.Ref();
	T* p3 = &s;
	const T* p4 = &s;

	// Unary operators
	bool b2 = !st;
	t = +st;

	st++;
	++st;
	st--;
	--st;
	t = ~st;

	// Get compile time coverage of negation
	T x = 1;
	T result;

	(void)SafeNegation(x, result);

}